

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_format_proto3.pb.cc
# Opt level: O2

size_t __thiscall proto3::MapOutWireFormat::ByteSizeLong(MapOutWireFormat *this)

{
  RepeatedPtrField<proto3::MapOutWireFormat_Map1Entry> *this_00;
  RepeatedPtrField<proto3::MapOutWireFormat_Map2Entry> *this_01;
  RepeatedPtrField<proto3::MapOutWireFormat_Map3Entry> *this_02;
  RepeatedPtrField<proto3::MapOutWireFormat_Map4Entry> *this_03;
  void **ppvVar1;
  const_iterator cVar2;
  size_t sVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  size_t sVar7;
  string *value;
  long lVar8;
  
  lVar8 = (long)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.map1_;
  ppvVar1 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&this_00->super_RepeatedPtrFieldBase);
  cVar2 = google::protobuf::RepeatedPtrField<proto3::MapOutWireFormat_Map1Entry>::end(this_00);
  for (; ppvVar1 != cVar2.it_; ppvVar1 = ppvVar1 + 1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto3::MapOutWireFormat_Map1Entry>((MapOutWireFormat_Map1Entry *)*ppvVar1);
    lVar8 = lVar8 + sVar3;
  }
  lVar8 = lVar8 + *(int *)((long)&this->field_0 + 0x28);
  this_01 = &(this->field_0)._impl_.map2_;
  ppvVar1 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&this_01->super_RepeatedPtrFieldBase);
  cVar4 = google::protobuf::RepeatedPtrField<proto3::MapOutWireFormat_Map2Entry>::end(this_01);
  for (; ppvVar1 != cVar4.it_; ppvVar1 = ppvVar1 + 1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto3::MapOutWireFormat_Map2Entry>((MapOutWireFormat_Map2Entry *)*ppvVar1);
    lVar8 = lVar8 + sVar3;
  }
  lVar8 = lVar8 + *(int *)((long)&this->field_0 + 0x40);
  this_02 = &(this->field_0)._impl_.map3_;
  ppvVar1 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&this_02->super_RepeatedPtrFieldBase);
  cVar5 = google::protobuf::RepeatedPtrField<proto3::MapOutWireFormat_Map3Entry>::end(this_02);
  for (; ppvVar1 != cVar5.it_; ppvVar1 = ppvVar1 + 1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto3::MapOutWireFormat_Map3Entry>((MapOutWireFormat_Map3Entry *)*ppvVar1);
    lVar8 = lVar8 + sVar3;
  }
  sVar3 = lVar8 + *(int *)((long)&this->field_0 + 0x58);
  this_03 = &(this->field_0)._impl_.map4_;
  ppvVar1 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&this_03->super_RepeatedPtrFieldBase);
  cVar6 = google::protobuf::RepeatedPtrField<proto3::MapOutWireFormat_Map4Entry>::end(this_03);
  for (; ppvVar1 != cVar6.it_; ppvVar1 = ppvVar1 + 1) {
    sVar7 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto3::MapOutWireFormat_Map4Entry>((MapOutWireFormat_Map4Entry *)*ppvVar1);
    sVar3 = sVar3 + sVar7;
  }
  if (((undefined1  [112])((undefined1  [112])this->field_0 & (undefined1  [112])0x1) !=
       (undefined1  [112])0x0) &&
     (value = (string *)((ulong)(this->field_0)._impl_.bar_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
     value->_M_string_length != 0)) {
    sVar7 = google::protobuf::internal::WireFormatLite::StringSize(value);
    sVar3 = sVar3 + sVar7 + 1;
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t MapOutWireFormat::ByteSizeLong() const {
  const MapOutWireFormat& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3.MapOutWireFormat)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto3.MapOutWireFormat.Map1Entry map1 = 1;
    {
      total_size += 1UL * this_._internal_map1_size();
      for (const auto& msg : this_._internal_map1()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto3.MapOutWireFormat.Map2Entry map2 = 2;
    {
      total_size += 1UL * this_._internal_map2_size();
      for (const auto& msg : this_._internal_map2()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto3.MapOutWireFormat.Map3Entry map3 = 3;
    {
      total_size += 1UL * this_._internal_map3_size();
      for (const auto& msg : this_._internal_map3()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto3.MapOutWireFormat.Map4Entry map4 = 5;
    {
      total_size += 1UL * this_._internal_map4_size();
      for (const auto& msg : this_._internal_map4()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
   {
    // string bar = 4;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!this_._internal_bar().empty()) {
        total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                        this_._internal_bar());
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}